

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O1

string * __thiscall
hgdb::json::SymbolTable::output_abi_cxx11_(string *__return_storage_ptr__,SymbolTable *this)

{
  pointer pcVar1;
  long lVar2;
  pointer puVar3;
  Module *pMVar4;
  pointer pVVar5;
  JSONWriter *pJVar6;
  _Base_ptr p_Var7;
  unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *m;
  pointer puVar8;
  _Rb_tree_header *p_Var9;
  undefined1 *puVar10;
  Variable *v;
  pointer this_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  undefined1 local_230 [8];
  JSONWriter w;
  long local_98 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string *local_48;
  SymbolTable *local_40;
  char local_31;
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_230);
  local_31 = '{';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w.s_.field_0x8,&local_31,1);
  name._M_str = "generator";
  name._M_len = 9;
  pJVar6 = JSONWriter::key((JSONWriter *)local_230,name);
  pcVar1 = (this->framework_name_)._M_dataplus._M_p;
  w.s_._384_8_ = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&w.s_.field_0x180,pcVar1,pcVar1 + (this->framework_name_)._M_string_length);
  JSONWriter::value<std::__cxx11::string>
            (pJVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &w.s_.field_0x180);
  if ((long *)w.s_._384_8_ != local_98) {
    operator_delete((void *)w.s_._384_8_,local_98[0] + 1);
  }
  if ((this->top_names_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    name_00._M_str = "top";
    name_00._M_len = 3;
    pJVar6 = JSONWriter::key((JSONWriter *)local_230,name_00);
    p_Var7 = (this->top_names_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar2 = *(long *)(p_Var7 + 1);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,lVar2,(long)&(p_Var7[1]._M_parent)->_M_color + lVar2);
    JSONWriter::value<std::__cxx11::string>(pJVar6,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    name_01._M_str = "top";
    name_01._M_len = 3;
    pJVar6 = JSONWriter::key((JSONWriter *)local_230,name_01);
    local_31 = '[';
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(pJVar6->s_).field_0x10,&local_31,1);
    p_Var7 = (this->top_names_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var9 = &(this->top_names_)._M_t._M_impl.super__Rb_tree_header;
    local_48 = __return_storage_ptr__;
    local_40 = this;
    if ((_Rb_tree_header *)p_Var7 != p_Var9) {
      do {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,*(long *)(p_Var7 + 1),
                   (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
        JSONWriter::value<std::__cxx11::string>((JSONWriter *)local_230,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var9);
    }
    JSONWriter::end_array((JSONWriter *)local_230);
    __return_storage_ptr__ = local_48;
    this = local_40;
  }
  name_02._M_str = "table";
  name_02._M_len = 5;
  pJVar6 = JSONWriter::key((JSONWriter *)local_230,name_02);
  local_31 = '[';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pJVar6->s_).field_0x10,&local_31,1);
  puVar8 = (this->modules_).
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->modules_).
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar3) {
    do {
      pMVar4 = (puVar8->_M_t).
               super___uniq_ptr_impl<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>.
               _M_t.
               super__Tuple_impl<0UL,_hgdb::json::Module_*,_std::default_delete<hgdb::json::Module>_>
               .super__Head_base<0UL,_hgdb::json::Module_*,_false>._M_head_impl;
      (*(code *)*(pMVar4->super_Scope<hgdb::json::Module>).super_ScopeBase._vptr_ScopeBase)
                (pMVar4,local_230);
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar3);
  }
  JSONWriter::end_array((JSONWriter *)local_230);
  if ((this->variables_).
      super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->variables_).
      super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    name_03._M_str = "variables";
    name_03._M_len = 9;
    JSONWriter::key((JSONWriter *)local_230,name_03);
    local_31 = '[';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w.s_.field_0x8,&local_31,1);
    this_00 = (this->variables_).
              super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pVVar5 = (this->variables_).
             super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (this_00 != pVVar5) {
      do {
        Variable::serialize(this_00,(JSONWriter *)local_230);
        this_00 = this_00 + 1;
      } while (this_00 != pVVar5);
    }
    JSONWriter::end_array((JSONWriter *)local_230);
  }
  if (this->reorder_ == false) {
    name_04._M_str = "reorder";
    name_04._M_len = 7;
    pJVar6 = JSONWriter::key((JSONWriter *)local_230,name_04);
    puVar10 = &(pJVar6->s_).field_0x10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar10,"false",5);
    local_31 = ',';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar10,&local_31,1);
  }
  JSONWriter::end_obj((JSONWriter *)local_230);
  JSONWriter::str_abi_cxx11_(__return_storage_ptr__,(JSONWriter *)local_230);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_230);
  std::ios_base::~ios_base((ios_base *)&w.s_.field_0x78);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string output() const {
        JSONWriter w;
        w.begin_obj();
        w.key("generator").value(framework_name_);

        if (top_names_.size() == 1) {
            w.key("top").value(*top_names_.begin());
        } else {
            w.key("top").begin_array();
            for (auto const &n : top_names_) w.value(n);
            w.end_array();
        }

        w.key("table").begin_array();
        for (auto const &m : modules_) {
            m->serialize(w);
        }
        w.end_array();

        if (!variables_.empty()) {
            w.key("variables");
            w.begin_array();
            for (auto const &v : variables_) {
                v.serialize(w);
            }
            w.end_array();
        }

        // attributes
        if (!reorder_) {
            w.key("reorder").value(false);
        }

        w.end_obj();
        return w.str();
    }